

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase813::run(TestCase813 *this)

{
  ArrayPtr<const_kj::OwnFd> fds;
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  AsyncIoProvider *pAVar4;
  void *pvVar5;
  OwnFd *pOVar6;
  AsyncCapabilityStream *pAVar7;
  undefined4 extraout_var;
  ArrayPtr<const_unsigned_char> AVar8;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData;
  OwnFd *local_630;
  size_t *local_590;
  OwnFd *local_578;
  Fault local_528;
  Fault f_21;
  long *local_518;
  undefined1 local_510 [8];
  DebugComparison<long_&,_int> _kjCondition_7;
  Fault f_20;
  Fault f_19;
  SyscallResult local_4bc;
  SyscallResult _kjSyscallResult_10;
  Fault f_18;
  long *local_4a8;
  undefined1 local_4a0 [8];
  DebugComparison<long_&,_int> _kjCondition_6;
  Fault f_17;
  Fault f_16;
  SyscallResult local_44c;
  SyscallResult _kjSyscallResult_9;
  Fault f_15;
  ArrayPtr<const_char> local_430;
  undefined1 local_420 [8];
  DebugComparison<kj::StringPtr,_const_char_(&)[4]> _kjCondition_5;
  Fault f_14;
  long *local_3e0;
  undefined1 local_3d8 [8];
  DebugComparison<long_&,_int> _kjCondition_4;
  Fault f_13;
  SyscallResult local_38c;
  SyscallResult _kjSyscallResult_8;
  Fault f_12;
  long *local_378;
  undefined1 local_370 [8];
  DebugComparison<long_&,_int> _kjCondition_3;
  Fault f_11;
  Fault f_10;
  SyscallResult local_31c;
  SyscallResult _kjSyscallResult_7;
  Fault f_9;
  ArrayPtr<const_char> local_300;
  undefined1 local_2f0 [8];
  DebugComparison<kj::StringPtr,_const_char_(&)[4]> _kjCondition_2;
  Fault f_8;
  long *local_2b0;
  undefined1 local_2a8 [8];
  DebugComparison<long_&,_int> _kjCondition_1;
  Fault f_7;
  SyscallResult local_25c;
  undefined1 auStack_258 [4];
  SyscallResult _kjSyscallResult_6;
  ssize_t n;
  char buffer [4];
  Fault f_6;
  SyscallResult local_234;
  SyscallResult _kjSyscallResult_5;
  Fault f_5;
  SyscallResult local_21c;
  SyscallResult _kjSyscallResult_4;
  Fault f_4;
  SyscallResult local_204;
  uchar *puStack_200;
  SyscallResult _kjSyscallResult_3;
  FdOutputStream local_1f0;
  ArrayPtr<const_unsigned_char> local_1e0;
  FdOutputStream local_1d0;
  Fault local_1c0;
  Fault f_3;
  unsigned_long *local_1b0;
  undefined1 local_1a8 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  SourceLocation local_178;
  Promise<kj::AsyncCapabilityStream::ReadResult> local_160;
  void *local_158;
  ReadResult result;
  OwnFd fdBuffer [2];
  undefined1 auStack_138 [3];
  char buffer_1 [4];
  OwnFd *local_120;
  void *pvStack_118;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_110;
  ArrayPtr<const_unsigned_char> local_100;
  undefined1 local_f0 [16];
  OwnFd local_e0;
  OwnFd sendFds [3];
  OwnFd out3;
  OwnFd in3;
  Fault f_2;
  SyscallResult local_bc;
  OwnFd local_b8;
  SyscallResult _kjSyscallResult_2;
  OwnFd out2;
  OwnFd in2;
  Fault f_1;
  SyscallResult local_9c;
  OwnFd local_98;
  SyscallResult _kjSyscallResult_1;
  OwnFd out1;
  OwnFd in1;
  Fault f;
  SyscallResult local_7c;
  undefined1 auStack_78 [4];
  SyscallResult _kjSyscallResult;
  int pipeFds [2];
  undefined1 local_60 [8];
  CapabilityPipe capPipe;
  AsyncIoContext io;
  TestCase813 *this_local;
  
  io.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar4 = Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&io.lowLevelProvider.ptr);
  (*pAVar4->_vptr_AsyncIoProvider[2])(local_60);
  _auStack_78 = (char *)0x0;
  f.exception = (Exception *)auStack_78;
  local_7c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__0>
                       ((anon_class_8_1_619a3dc7 *)&f,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_7c);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_7c);
    kj::_::Debug::Fault::Fault
              ((Fault *)&out1,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x33a,iVar3,"miniposix::pipe(pipeFds)","");
    kj::_::Debug::Fault::fatal((Fault *)&out1);
  }
  OwnFd::OwnFd((OwnFd *)&_kjSyscallResult_1,(int)auStack_78);
  OwnFd::OwnFd(&local_98,_kjSyscallResult.errorNumber);
  f_1.exception = (Exception *)auStack_78;
  local_9c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__1>
                       ((anon_class_8_1_619a3dc7 *)&f_1,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_9c);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_9c);
    kj::_::Debug::Fault::Fault
              ((Fault *)&out2,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x33e,iVar3,"miniposix::pipe(pipeFds)","");
    kj::_::Debug::Fault::fatal((Fault *)&out2);
  }
  OwnFd::OwnFd((OwnFd *)&_kjSyscallResult_2,(int)auStack_78);
  OwnFd::OwnFd(&local_b8,_kjSyscallResult.errorNumber);
  f_2.exception = (Exception *)auStack_78;
  local_bc = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__2>
                       ((anon_class_8_1_619a3dc7 *)&f_2,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_bc);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_bc);
    kj::_::Debug::Fault::Fault
              ((Fault *)&out3,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x342,iVar3,"miniposix::pipe(pipeFds)","");
    kj::_::Debug::Fault::fatal((Fault *)&out3);
  }
  OwnFd::OwnFd(sendFds + 2,(int)auStack_78);
  OwnFd::OwnFd(sendFds + 1,_kjSyscallResult.errorNumber);
  pOVar6 = mv<kj::OwnFd>(&local_98);
  OwnFd::OwnFd((OwnFd *)(local_f0 + 0xc),pOVar6);
  pOVar6 = mv<kj::OwnFd>(&local_b8);
  OwnFd::OwnFd(&local_e0,pOVar6);
  pOVar6 = mv<kj::OwnFd>(sendFds + 1);
  OwnFd::OwnFd(sendFds,pOVar6);
  pAVar7 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)local_60);
  local_100 = operator___kjb<kj::_::ByteLiteral<4UL>__102,_111,_111__>();
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::ArrayPtr(&local_110,(void *)0x0);
  ArrayPtr<kj::OwnFd_const>::ArrayPtr<3ul>
            ((ArrayPtr<kj::OwnFd_const> *)&local_120,(OwnFd (*) [3])(local_f0 + 0xc));
  fds.size_ = (size_t)pvStack_118;
  fds.ptr = local_120;
  moreData.size_ = (size_t)local_110.ptr;
  moreData.ptr = (ArrayPtr<const_unsigned_char> *)local_100.size_;
  AVar8.size_ = (size_t)local_100.ptr;
  AVar8.ptr = (uchar *)pAVar7;
  AsyncCapabilityStream::writeWithFds((AsyncCapabilityStream *)local_f0,AVar8,moreData,fds);
  pAVar4 = io.provider.ptr;
  SourceLocation::SourceLocation
            ((SourceLocation *)auStack_138,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x348,5);
  Promise<void>::wait((Promise<void> *)local_f0,pAVar4);
  Promise<void>::~Promise((Promise<void> *)local_f0);
  local_578 = sendFds + 1;
  do {
    local_578 = local_578 + -1;
    OwnFd::~OwnFd(local_578);
  } while (local_578 != (OwnFd *)(local_f0 + 0xc));
  memset((void *)((long)&fdBuffer[0].fd + 3),0,4);
  local_590 = &result.capCount;
  do {
    OwnFd::OwnFd((OwnFd *)local_590);
    local_590 = (size_t *)((long)local_590 + 4);
  } while ((OwnFd *)local_590 != fdBuffer);
  pAVar7 = Own<kj::AsyncCapabilityStream,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncCapabilityStream,_std::nullptr_t> *)&capPipe.ends[0].ptr);
  (*(pAVar7->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream[0xf])
            (&local_160,pAVar7,(undefined1 *)((long)&fdBuffer[0].fd + 3),3,3,&result.capCount,2);
  SourceLocation::SourceLocation
            (&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
             ,"run",0x34e,0x13);
  _Var2 = Promise<kj::AsyncCapabilityStream::ReadResult>::wait(&local_160,io.provider.ptr);
  local_158 = (void *)CONCAT44(extraout_var,_Var2);
  Promise<kj::AsyncCapabilityStream::ReadResult>::~Promise(&local_160);
  local_1b0 = (unsigned_long *)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&result.byteCount);
  f_3.exception._4_4_ = 2;
  kj::_::DebugExpression<unsigned_long&>::operator==
            ((DebugComparison<unsigned_long_&,_int> *)local_1a8,
             (DebugExpression<unsigned_long&> *)&local_1b0,(int *)((long)&f_3.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1a8);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&>
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x34f,FAILED,"result.capCount == 2","_kjCondition,",
               (DebugComparison<unsigned_long_&,_int> *)local_1a8);
    kj::_::Debug::Fault::fatal(&local_1c0);
  }
  iVar3 = OwnFd::get((OwnFd *)&result.capCount);
  FdOutputStream::FdOutputStream(&local_1d0,iVar3);
  local_1e0 = operator___kjb<kj::_::ByteLiteral<4UL>__98,_97,_114__>();
  FdOutputStream::write(&local_1d0,(int)local_1e0.ptr,(void *)local_1e0.size_,(size_t)local_1e0.ptr)
  ;
  FdOutputStream::~FdOutputStream(&local_1d0);
  iVar3 = OwnFd::get((OwnFd *)((long)&result.capCount + 4));
  FdOutputStream::FdOutputStream(&local_1f0,iVar3);
  AVar8 = operator___kjb<kj::_::ByteLiteral<4UL>__98,_97,_122__>();
  puStack_200 = AVar8.ptr;
  FdOutputStream::write(&local_1f0,(int)AVar8.ptr,(void *)AVar8.size_,(size_t)puStack_200);
  FdOutputStream::~FdOutputStream(&local_1f0);
  local_630 = fdBuffer;
  do {
    local_630 = local_630 + -1;
    OwnFd::~OwnFd(local_630);
  } while (local_630 != (OwnFd *)&result.capCount);
  f_4.exception = (Exception *)&_kjSyscallResult_1;
  local_204 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__3>
                        ((anon_class_8_1_ba1d530c *)&f_4,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_204);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_204);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffde8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x356,iVar3,"fcntl(in1, F_SETFL, O_NONBLOCK)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffde8);
  }
  f_5.exception = (Exception *)&_kjSyscallResult_2;
  local_21c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__4>
                        ((anon_class_8_1_ba1d530d *)&f_5,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_21c);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_21c);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffdd0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x357,iVar3,"fcntl(in2, F_SETFL, O_NONBLOCK)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffdd0);
  }
  f_6.exception = (Exception *)(sendFds + 2);
  local_234 = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__5>
                        ((anon_class_8_1_ba1d530e *)&f_6,false);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_234);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_234);
    kj::_::Debug::Fault::Fault
              ((Fault *)&stack0xfffffffffffffdb8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x358,iVar3,"fcntl(in3, F_SETFL, O_NONBLOCK)","");
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffdb8);
  }
  n._4_4_ = 0;
  f_7.exception = (Exception *)auStack_258;
  local_25c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__6>
                        ((anon_class_24_3_34959099 *)&f_7,true);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_25c);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_25c);
    kj::_::Debug::Fault::Fault
              ((Fault *)&_kjCondition_1.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x35e,iVar3,"n = read(in1, buffer, 4)","");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
  }
  local_2b0 = (long *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_258);
  f_8.exception._4_4_ = 3;
  kj::_::DebugExpression<long&>::operator==
            ((DebugComparison<long_&,_int> *)local_2a8,(DebugExpression<long&> *)&local_2b0,
             (int *)((long)&f_8.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2a8);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&_kjCondition_2.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x35f,FAILED,"n == 3","_kjCondition,",(DebugComparison<long_&,_int> *)local_2a8);
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
  }
  n._4_4_ = n._4_4_ & 0xffffff;
  StringPtr::StringPtr((StringPtr *)&f_9,(char *)((long)&n + 4));
  local_300 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StringPtr *)&f_9);
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_2f0,
             (DebugExpression<kj::StringPtr> *)&local_300,(char (*) [4])0x91cc8d);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2f0);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
              ((Fault *)&stack0xfffffffffffffce8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x361,FAILED,"kj::StringPtr(buffer) == \"bar\"","_kjCondition,",
               (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_2f0);
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffce8);
  }
  f_10.exception = (Exception *)auStack_258;
  local_31c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__7>
                        ((anon_class_24_3_34959099 *)&f_10,true);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_31c);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_31c);
    kj::_::Debug::Fault::Fault
              (&f_11,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x364,iVar3,"n = read(in1, buffer, 4)","");
    kj::_::Debug::Fault::fatal(&f_11);
  }
  if ((long)_auStack_258 < 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
              ((Fault *)&_kjCondition_3.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x366,FAILED,(char *)0x0,"\"out1 was not closed\"",
               (char (*) [20])"out1 was not closed");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_3.result);
  }
  local_378 = (long *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_258);
  f_12.exception._4_4_ = 0;
  kj::_::DebugExpression<long&>::operator==
            ((DebugComparison<long_&,_int> *)local_370,(DebugExpression<long&> *)&local_378,
             (int *)((long)&f_12.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_370);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&stack0xfffffffffffffc78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x368,FAILED,"n == 0","_kjCondition,",(DebugComparison<long_&,_int> *)local_370);
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffc78);
  }
  f_13.exception = (Exception *)auStack_258;
  local_38c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__8>
                        ((anon_class_24_3_349590b8 *)&f_13,true);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_38c);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_38c);
    kj::_::Debug::Fault::Fault
              ((Fault *)&_kjCondition_4.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x36b,iVar3,"n = read(in2, buffer, 4)","");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_4.result);
  }
  local_3e0 = (long *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_258);
  f_14.exception._4_4_ = 3;
  kj::_::DebugExpression<long&>::operator==
            ((DebugComparison<long_&,_int> *)local_3d8,(DebugExpression<long&> *)&local_3e0,
             (int *)((long)&f_14.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_3d8);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&_kjCondition_5.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x36c,FAILED,"n == 3","_kjCondition,",(DebugComparison<long_&,_int> *)local_3d8);
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_5.result);
  }
  n._4_4_ = n._4_4_ & 0xffffff;
  StringPtr::StringPtr((StringPtr *)&f_15,(char *)((long)&n + 4));
  local_430 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(StringPtr *)&f_15);
  kj::_::DebugExpression<kj::StringPtr>::operator==
            ((DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_420,
             (DebugExpression<kj::StringPtr> *)&local_430,(char (*) [4])0x91ea93);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_420);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::StringPtr,char_const(&)[4]>&>
              ((Fault *)&stack0xfffffffffffffbb8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x36e,FAILED,"kj::StringPtr(buffer) == \"baz\"","_kjCondition,",
               (DebugComparison<kj::StringPtr,_const_char_(&)[4]> *)local_420);
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffbb8);
  }
  f_16.exception = (Exception *)auStack_258;
  local_44c = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__9>
                        ((anon_class_24_3_349590b8 *)&f_16,true);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_44c);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_44c);
    kj::_::Debug::Fault::Fault
              (&f_17,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x371,iVar3,"n = read(in2, buffer, 4)","");
    kj::_::Debug::Fault::fatal(&f_17);
  }
  if ((long)_auStack_258 < 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20]>
              ((Fault *)&_kjCondition_6.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x373,FAILED,(char *)0x0,"\"out2 was not closed\"",
               (char (*) [20])"out2 was not closed");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_6.result);
  }
  local_4a8 = (long *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_258);
  f_18.exception._4_4_ = 0;
  kj::_::DebugExpression<long&>::operator==
            ((DebugComparison<long_&,_int> *)local_4a0,(DebugExpression<long&> *)&local_4a8,
             (int *)((long)&f_18.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_4a0);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              ((Fault *)&stack0xfffffffffffffb48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x375,FAILED,"n == 0","_kjCondition,",(DebugComparison<long_&,_int> *)local_4a0);
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffb48);
  }
  f_19.exception = (Exception *)auStack_258;
  local_4bc = kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase813::run()::__10>
                        ((anon_class_24_3_349590d7 *)&f_19,true);
  pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_4bc);
  if (pvVar5 == (void *)0x0) {
    iVar3 = kj::_::Debug::SyscallResult::getErrorNumber(&local_4bc);
    kj::_::Debug::Fault::Fault
              (&f_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x378,iVar3,"n = read(in3, buffer, 4)","");
    kj::_::Debug::Fault::fatal(&f_20);
  }
  if ((long)_auStack_258 < 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[422]>
              ((Fault *)&_kjCondition_7.result,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x37e,FAILED,(char *)0x0,
               "\"out3 was not closed. This could indicate that your operating system kernel is \" \"buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was \" \"known to do this until late 2018, while MacOS still has this bug as of this writing in \" \"2019. However, KJ works around the problem on those platforms. You need to enable the \" \"same work-around for your OS -- search for \'SCM_RIGHTS\' in src/kj/async-io-unix.c++.\""
               ,(char (*) [422])
                "out3 was not closed. This could indicate that your operating system kernel is buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was known to do this until late 2018, while MacOS still has this bug as of this writing in 2019. However, KJ works around the problem on those platforms. You need to enable the same work-around for your OS -- search for \'SCM_RIGHTS\' in src/kj/async-io-unix.c++."
              );
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_7.result);
  }
  local_518 = (long *)kj::_::DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_258);
  f_21.exception._4_4_ = 0;
  kj::_::DebugExpression<long&>::operator==
            ((DebugComparison<long_&,_int> *)local_510,(DebugExpression<long&> *)&local_518,
             (int *)((long)&f_21.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_510);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&>
              (&local_528,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x380,FAILED,"n == 0","_kjCondition,",(DebugComparison<long_&,_int> *)local_510);
    kj::_::Debug::Fault::fatal(&local_528);
  }
  OwnFd::~OwnFd(sendFds + 1);
  OwnFd::~OwnFd(sendFds + 2);
  OwnFd::~OwnFd(&local_b8);
  OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult_2);
  OwnFd::~OwnFd(&local_98);
  OwnFd::~OwnFd((OwnFd *)&_kjSyscallResult_1);
  CapabilityPipe::~CapabilityPipe((CapabilityPipe *)local_60);
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&capPipe.ends[1].ptr);
  return;
}

Assistant:

TEST(AsyncIo, ScmRightsTruncatedEven) {
  // Test that if we send three FDs over a unix socket, but the receiving end only receives two, we
  // don't leak the third FD. This is different from the send-two-receive-one case in that
  // CMSG_SPACE() on many systems rounds up such that there is always space for an even number of
  // FDs. In that case the other test only verifies that our userspace code to close unwanted FDs
  // is correct, whereas *this* test really verifies that the *kernel* properly closes truncated
  // FDs.

  auto io = setupAsyncIo();

  auto capPipe = io.provider->newCapabilityPipe();

  int pipeFds[2]{};
  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in1(pipeFds[0]);
  kj::OwnFd out1(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in2(pipeFds[0]);
  kj::OwnFd out2(pipeFds[1]);

  KJ_SYSCALL(miniposix::pipe(pipeFds));
  kj::OwnFd in3(pipeFds[0]);
  kj::OwnFd out3(pipeFds[1]);

  {
    OwnFd sendFds[3] = { kj::mv(out1), kj::mv(out2), kj::mv(out3) };
    capPipe.ends[0]->writeWithFds("foo"_kjb, nullptr, sendFds).wait(io.waitScope);
  }

  {
    char buffer[4]{};
    OwnFd fdBuffer[2];
    auto result = capPipe.ends[1]->tryReadWithFds(buffer, 3, 3, fdBuffer, 2).wait(io.waitScope);
    KJ_ASSERT(result.capCount == 2);
    kj::FdOutputStream(fdBuffer[0].get()).write("bar"_kjb);
    kj::FdOutputStream(fdBuffer[1].get()).write("baz"_kjb);
  }

  // We want to carefully verify that out1, out2, and out3 were closed, without deadlocking if they
  // weren't. So we manually set nonblocking mode and then issue read()s.
  KJ_SYSCALL(fcntl(in1, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in2, F_SETFL, O_NONBLOCK));
  KJ_SYSCALL(fcntl(in3, F_SETFL, O_NONBLOCK));

  char buffer[4]{};
  ssize_t n;

  // First we read "bar" from in1.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "bar");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in1, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out1 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Next we read "baz" from in2.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  KJ_ASSERT(n == 3);
  buffer[3] = '\0';
  KJ_ASSERT(kj::StringPtr(buffer) == "baz");

  // Now it should be EOF.
  KJ_NONBLOCKING_SYSCALL(n = read(in2, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out2 was not closed");
  }
  KJ_ASSERT(n == 0);

  // Third pipe should have been closed implicitly because we didn't provide space to receive it.
  KJ_NONBLOCKING_SYSCALL(n = read(in3, buffer, 4));
  if (n < 0) {
    KJ_FAIL_ASSERT("out3 was not closed. This could indicate that your operating system kernel is "
        "buggy and leaks file descriptors when an SCM_RIGHTS message is truncated. FreeBSD was "
        "known to do this until late 2018, while MacOS still has this bug as of this writing in "
        "2019. However, KJ works around the problem on those platforms. You need to enable the "
        "same work-around for your OS -- search for 'SCM_RIGHTS' in src/kj/async-io-unix.c++.");
  }
  KJ_ASSERT(n == 0);
}